

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnScanState::Initialize
          (ColumnScanState *this,LogicalType *type,vector<duckdb::StorageIndex,_true> *children,
          optional_ptr<duckdb::TableScanOptions,_true> options)

{
  PhysicalType PVar1;
  size_type __n;
  child_list_t<LogicalType> *this_00;
  size_type __new_size;
  const_reference pvVar2;
  reference pvVar3;
  const_reference pvVar4;
  LogicalType *pLVar5;
  idx_t i;
  ulong uVar6;
  vector<bool,_true> *this_01;
  vector<duckdb::ColumnScanState,_true> *pvVar7;
  reference rVar8;
  
  (this->scan_options).ptr = options.ptr;
  if (type->id_ != VALIDITY) {
    PVar1 = type->physical_type_;
    if (PVar1 == LIST) {
      pvVar7 = &this->child_states;
      ::std::vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>::resize
                (&pvVar7->
                  super_vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>,2)
      ;
      pvVar3 = vector<duckdb::ColumnScanState,_true>::get<true>(pvVar7,1);
      pLVar5 = ListType::GetChildType(type);
      Initialize(pvVar3,pLVar5,options);
      pvVar3 = vector<duckdb::ColumnScanState,_true>::get<true>(pvVar7,0);
      (pvVar3->scan_options).ptr = options.ptr;
    }
    else {
      if (PVar1 == ARRAY) {
        pvVar7 = &this->child_states;
        ::std::vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>::resize
                  (&pvVar7->
                    super_vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>,
                   2);
        pvVar3 = vector<duckdb::ColumnScanState,_true>::get<true>(pvVar7,0);
        (pvVar3->scan_options).ptr = options.ptr;
        pvVar3 = vector<duckdb::ColumnScanState,_true>::get<true>(pvVar7,1);
        pLVar5 = ArrayType::GetChildType(type);
        Initialize(pvVar3,pLVar5,options);
        return;
      }
      if (PVar1 == STRUCT) {
        this_00 = StructType::GetChildTypes_abi_cxx11_(type);
        pvVar7 = &this->child_states;
        ::std::vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>::resize
                  (&pvVar7->
                    super_vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>,
                   ((long)(this_00->
                          super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                          ).
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this_00->
                         super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                         ).
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x38 + 1);
        this_01 = &this->scan_child_column;
        __new_size = ((long)(this_00->
                            super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                            ).
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this_00->
                           super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                           ).
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x38;
        if ((children->super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>).
            super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
            super__Vector_impl_data._M_start ==
            (children->super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>).
            super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          ::std::vector<bool,_std::allocator<bool>_>::resize
                    (&this_01->super_vector<bool,_std::allocator<bool>_>,__new_size,true);
          uVar6 = 0;
          while (uVar6 < (ulong)(((long)(this_00->
                                        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                        ).
                                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this_00->
                                       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                       ).
                                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) / 0x38)) {
            pvVar3 = vector<duckdb::ColumnScanState,_true>::get<true>(pvVar7,uVar6 + 1);
            pvVar4 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                     ::get<true>(this_00,uVar6);
            Initialize(pvVar3,&pvVar4->second,options);
            uVar6 = uVar6 + 1;
          }
        }
        else {
          ::std::vector<bool,_std::allocator<bool>_>::resize
                    (&this_01->super_vector<bool,_std::allocator<bool>_>,__new_size,false);
          for (uVar6 = 0;
              uVar6 < (ulong)((long)(children->
                                    super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                    ).
                                    super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(children->
                                    super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                    ).
                                    super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5);
              uVar6 = uVar6 + 1) {
            pvVar2 = vector<duckdb::StorageIndex,_true>::get<true>(children,uVar6);
            __n = pvVar2->index;
            rVar8 = vector<bool,_true>::get<true>(this_01,__n);
            *rVar8._M_p = *rVar8._M_p | rVar8._M_mask;
            pvVar3 = vector<duckdb::ColumnScanState,_true>::get<true>(pvVar7,__n + 1);
            pvVar4 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                     ::get<true>(this_00,__n);
            Initialize(pvVar3,&pvVar4->second,&pvVar2->child_indexes,options);
          }
        }
      }
      else {
        ::std::vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>::resize
                  (&(this->child_states).
                    super_vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>,
                   1);
      }
      pvVar3 = vector<duckdb::ColumnScanState,_true>::get<true>(&this->child_states,0);
      (pvVar3->scan_options).ptr = options.ptr;
    }
  }
  return;
}

Assistant:

void ColumnScanState::Initialize(const LogicalType &type, const vector<StorageIndex> &children,
                                 optional_ptr<TableScanOptions> options) {
	// Register the options in the state
	scan_options = options;

	if (type.id() == LogicalTypeId::VALIDITY) {
		// validity - nothing to initialize
		return;
	}
	if (type.InternalType() == PhysicalType::STRUCT) {
		// validity + struct children
		auto &struct_children = StructType::GetChildTypes(type);
		child_states.resize(struct_children.size() + 1);

		if (children.empty()) {
			// scan all struct children
			scan_child_column.resize(struct_children.size(), true);
			for (idx_t i = 0; i < struct_children.size(); i++) {
				child_states[i + 1].Initialize(struct_children[i].second, options);
			}
		} else {
			// only scan the specified subset of columns
			scan_child_column.resize(struct_children.size(), false);
			for (idx_t i = 0; i < children.size(); i++) {
				auto &child = children[i];
				auto index = child.GetPrimaryIndex();
				auto &child_indexes = child.GetChildIndexes();
				scan_child_column[index] = true;
				child_states[index + 1].Initialize(struct_children[index].second, child_indexes, options);
			}
		}
		child_states[0].scan_options = options;
	} else if (type.InternalType() == PhysicalType::LIST) {
		// validity + list child
		child_states.resize(2);
		child_states[1].Initialize(ListType::GetChildType(type), options);
		child_states[0].scan_options = options;
	} else if (type.InternalType() == PhysicalType::ARRAY) {
		// validity + array child
		child_states.resize(2);
		child_states[0].scan_options = options;
		child_states[1].Initialize(ArrayType::GetChildType(type), options);
	} else {
		// validity
		child_states.resize(1);
		child_states[0].scan_options = options;
	}
}